

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs12_test.cc
# Opt level: O2

bool PKCS12CreateVector(vector<unsigned_char,_std::allocator<unsigned_char>_> *out,EVP_PKEY *pkey,
                       vector<x509_st_*,_std::allocator<x509_st_*>_> *certs)

{
  pointer ppxVar1;
  unique_ptr<stack_st_X509,_bssl::internal::Deleter> sk;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  enable_if_t<_internal::StackTraits<stack_st_X509>::kIsConst,_bool> eVar2;
  uint uVar3;
  uint uVar4;
  pointer ppxVar5;
  bool bVar6;
  UniquePtr<struct_stack_st_X509> chain;
  UniquePtr<PKCS12> p12;
  uint8_t *ptr;
  unique_ptr<stack_st_X509,_bssl::internal::Deleter> local_58;
  _Head_base<0UL,_pkcs12_st_*,_false> local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  bssl local_40 [8];
  pointer local_38;
  
  local_58._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
       (__uniq_ptr_data<stack_st_X509,_bssl::internal::Deleter,_true,_true>)OPENSSL_sk_new_null();
  if (local_58._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>)0x0) {
    ppxVar5 = (certs->super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    ppxVar1 = (certs->super__Vector_base<x509_st_*,_std::allocator<x509_st_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    local_48 = out;
    do {
      sk._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl =
           local_58._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl;
      if (ppxVar5 == ppxVar1) {
        local_50._M_head_impl =
             (pkcs12_st *)
             PKCS12_create("foo",(char *)0x0,(EVP_PKEY *)pkey,(X509 *)0x0,
                           (stack_st_X509 *)
                           local_58._M_t.
                           super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,0,0,0,0,0);
        this = local_48;
        if ((PKCS12 *)local_50._M_head_impl == (PKCS12 *)0x0) {
LAB_002fed4e:
          bVar6 = false;
        }
        else {
          uVar3 = i2d_PKCS12((PKCS12 *)local_50._M_head_impl,(uchar **)0x0);
          if ((int)uVar3 < 0) goto LAB_002fed4e;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,(ulong)uVar3);
          local_38 = (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
          uVar4 = i2d_PKCS12((PKCS12 *)local_50._M_head_impl,&local_38);
          bVar6 = uVar4 == uVar3;
        }
        std::unique_ptr<pkcs12_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<pkcs12_st,_bssl::internal::Deleter> *)&local_50);
        goto LAB_002fed5a;
      }
      bssl::UpRef(local_40,*ppxVar5);
      eVar2 = bssl::PushToStack<stack_st_X509>
                        ((stack_st_X509 *)
                         sk._M_t.super___uniq_ptr_impl<stack_st_X509,_bssl::internal::Deleter>._M_t.
                         super__Tuple_impl<0UL,_stack_st_X509_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_stack_st_X509_*,_false>._M_head_impl,
                         (UniquePtr<typename_internal::StackTraits<stack_st_X509>::Type> *)local_40)
      ;
      std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<x509_st,_bssl::internal::Deleter> *)local_40);
      ppxVar5 = ppxVar5 + 1;
    } while (eVar2);
  }
  bVar6 = false;
LAB_002fed5a:
  std::unique_ptr<stack_st_X509,_bssl::internal::Deleter>::~unique_ptr(&local_58);
  return bVar6;
}

Assistant:

static bool PKCS12CreateVector(std::vector<uint8_t> *out, EVP_PKEY *pkey,
                               const std::vector<X509 *> &certs) {
  bssl::UniquePtr<STACK_OF(X509)> chain(sk_X509_new_null());
  if (!chain) {
    return false;
  }

  for (X509 *cert : certs) {
    if (!bssl::PushToStack(chain.get(), bssl::UpRef(cert))) {
      return false;
    }
  }

  bssl::UniquePtr<PKCS12> p12(PKCS12_create(kPassword, nullptr /* name */, pkey,
                                            nullptr /* cert */, chain.get(), 0,
                                            0, 0, 0, 0));
  if (!p12) {
    return false;
  }

  int len = i2d_PKCS12(p12.get(), nullptr);
  if (len < 0) {
    return false;
  }
  out->resize(static_cast<size_t>(len));
  uint8_t *ptr = out->data();
  return i2d_PKCS12(p12.get(), &ptr) == len;
}